

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O1

int CmdCommandSis(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  FILE *__stream;
  char *pcVar2;
  char *pcVar3;
  FILE *pFVar4;
  Abc_Ntk_t *pAVar5;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  char Command [1000];
  char Buffer [100];
  char local_488 [8];
  char acStack_480 [7];
  undefined8 uStack_479;
  char local_98 [104];
  
  pNtk = Abc_FrameReadNtk(pAbc);
  Abc_FrameReadOut(pAbc);
  __stream = (FILE *)Abc_FrameReadErr(pAbc);
  if (argc != 1) {
    pcVar2 = argv[1];
    iVar1 = strcmp(pcVar2,"-h");
    if ((iVar1 != 0) && (iVar1 = strcmp(pcVar2,"-?"), iVar1 != 0)) {
      if (pNtk == (Abc_Ntk_t *)0x0) {
        pcVar2 = "Empty network.\n";
        sVar6 = 0xf;
      }
      else {
        pcVar2 = *argv;
        pcVar7 = "sis";
        iVar1 = strcmp(pcVar2,"sis");
        if (iVar1 != 0) {
          fprintf(__stream,"Wrong command: \"%s\".\n",pcVar2);
          goto LAB_008890fc;
        }
        pcVar2 = Cmd_FlagReadByName(pAbc,"siswin");
        if (pcVar2 == (char *)0x0) {
          pcVar2 = "sis.exe";
        }
        else {
          pcVar2 = Cmd_FlagReadByName(pAbc,"siswin");
        }
        pcVar3 = Cmd_FlagReadByName(pAbc,"sisunix");
        if (pcVar3 != (char *)0x0) {
          pcVar7 = Cmd_FlagReadByName(pAbc,"sisunix");
        }
        pFVar4 = fopen(pcVar2,"r");
        pcVar3 = pcVar2;
        if ((pFVar4 == (FILE *)0x0) &&
           (pFVar4 = fopen(pcVar7,"r"), pcVar3 = pcVar7, pFVar4 == (FILE *)0x0)) {
          fprintf(__stream,"Cannot find \"%s\" or \"%s\" in the current directory.\n",pcVar2,pcVar7)
          ;
          goto LAB_008890fc;
        }
        fclose(pFVar4);
        if ((pNtk->ntkFunc == ABC_FUNC_MAP) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
          Abc_NtkMapToSop(pNtk);
          puts("The current network is unmapped before calling SIS.");
        }
        if (pNtk->ntkType == ABC_NTK_LOGIC) {
          Abc_NtkToSop(pNtk,-1,1000000000);
        }
        pAVar5 = Abc_NtkToNetlist(pNtk);
        if (pAVar5 != (Abc_Ntk_t *)0x0) {
          Io_WriteBlif(pAVar5,"_sis_in.blif",1,0,0);
          Abc_NtkDelete(pAVar5);
          sprintf(local_488,"%s -x -c ",pcVar3);
          sVar6 = strlen(local_488);
          (local_488 + sVar6)[0] = '\"';
          (local_488 + sVar6)[1] = '\0';
          sVar6 = strlen(local_488);
          *(undefined8 *)((long)&uStack_479 + sVar6) = 0x66696c622e6e69;
          builtin_strncpy(local_488 + sVar6,"read_bli",8);
          builtin_strncpy(acStack_480 + sVar6,"f _sis_i",8);
          sVar6 = strlen(local_488);
          (local_488 + sVar6)[0] = ';';
          (local_488 + sVar6)[1] = ' ';
          local_488[sVar6 + 2] = '\0';
          if (1 < argc) {
            uVar8 = 1;
            do {
              sprintf(local_98," %s",argv[uVar8]);
              strcat(local_488,local_98);
              uVar8 = uVar8 + 1;
            } while ((uint)argc != uVar8);
          }
          sVar6 = strlen(local_488);
          (local_488 + sVar6)[0] = ';';
          (local_488 + sVar6)[1] = ' ';
          local_488[sVar6 + 2] = '\0';
          sVar6 = strlen(local_488);
          builtin_strncpy(local_488 + sVar6,"write_bl",8);
          builtin_strncpy(acStack_480 + sVar6,"if _sis_o",9);
          builtin_strncpy((char *)((long)&uStack_479 + sVar6 + 2),"ut.blif",8);
          sVar6 = strlen(local_488);
          (local_488 + sVar6)[0] = '\"';
          (local_488 + sVar6)[1] = '\0';
          iVar1 = Util_SignalSystem(local_488);
          if (iVar1 == 0) {
            pFVar4 = fopen("_sis_out.blif","r");
            if (pFVar4 != (FILE *)0x0) {
              fclose(pFVar4);
              pAVar5 = Io_Read("_sis_out.blif",IO_FILE_BLIF,1,0);
              if (pNtk->pSpec != (char *)0x0) {
                if (pAVar5->pSpec != (char *)0x0) {
                  free(pAVar5->pSpec);
                  pAVar5->pSpec = (char *)0x0;
                }
                pcVar2 = Extra_UtilStrsav(pNtk->pSpec);
                pAVar5->pSpec = pcVar2;
              }
              Abc_FrameReplaceCurrentNetwork(pAbc,pAVar5);
              unlink("_sis_in.blif");
              unlink("_sis_out.blif");
              return 0;
            }
            pcVar7 = "Cannot open SIS output file \"%s\".\n";
            pcVar2 = "_sis_out.blif";
          }
          else {
            fwrite("The following command has returned non-zero exit status:\n",0x39,1,__stream);
            pcVar7 = "\"%s\"\n";
            pcVar2 = local_488;
          }
          fprintf(__stream,pcVar7,pcVar2);
          unlink("_sis_in.blif");
          goto LAB_008890fc;
        }
        pcVar2 = "Cannot produce the intermediate network.\n";
        sVar6 = 0x29;
      }
      fwrite(pcVar2,sVar6,1,__stream);
    }
  }
LAB_008890fc:
  fwrite("Usage: sis [-h] <com>\n",0x16,1,__stream);
  fwrite("         invokes SIS command for the current ABC network\n",0x39,1,__stream);
  fwrite("         (the executable of SIS should be in the same directory)\n",0x41,1,__stream);
  fwrite("   -h  : print the command usage\n",0x21,1,__stream);
  fwrite(" <com> : a SIS command (or a semicolon-separated list of commands in quotes)\n",0x4d,1,
         __stream);
  fwrite("         Example 1: sis eliminate 0\n",0x24,1,__stream);
  fwrite("         Example 2: sis \"ps; rd; fx; ps\"\n",0x29,1,__stream);
  fwrite("         Example 3: sis source script.rugged\n",0x2d,1,__stream);
  return 1;
}

Assistant:

int CmdCommandSis( Abc_Frame_t * pAbc, int argc, char **argv )
{
    FILE * pFile;
    FILE * pOut, * pErr;
    Abc_Ntk_t * pNtk, * pNtkNew, * pNetlist;
    char * pNameWin = "sis.exe";
    char * pNameUnix = "sis";
    char Command[1000], Buffer[100];
    char * pSisName;
    int i;

    pNtk = Abc_FrameReadNtk(pAbc);
    pOut = Abc_FrameReadOut(pAbc);
    pErr = Abc_FrameReadErr(pAbc);

    if ( argc == 1 )
        goto usage;
    if ( strcmp( argv[1], "-h" ) == 0 )
        goto usage;
    if ( strcmp( argv[1], "-?" ) == 0 )
        goto usage;

    if ( pNtk == NULL )
    {
        fprintf( pErr, "Empty network.\n" );
        goto usage;
    }

    if ( strcmp( argv[0], "sis" ) != 0 )
    {
        fprintf( pErr, "Wrong command: \"%s\".\n", argv[0] );
        goto usage;
    }

    // get the names from the resource file
    if ( Cmd_FlagReadByName(pAbc, "siswin") )
        pNameWin = Cmd_FlagReadByName(pAbc, "siswin");
    if ( Cmd_FlagReadByName(pAbc, "sisunix") )
        pNameUnix = Cmd_FlagReadByName(pAbc, "sisunix");

    // check if SIS is available
    if ( (pFile = fopen( pNameWin, "r" )) )
        pSisName = pNameWin;
    else if ( (pFile = fopen( pNameUnix, "r" )) )
        pSisName = pNameUnix;
    else if ( pFile == NULL )
    {
        fprintf( pErr, "Cannot find \"%s\" or \"%s\" in the current directory.\n", pNameWin, pNameUnix );
        goto usage;
    }
    fclose( pFile );

    if ( Abc_NtkIsMappedLogic(pNtk) )
    {
        Abc_NtkMapToSop(pNtk);
        printf( "The current network is unmapped before calling SIS.\n" );
    }

    // write out the current network
    if ( Abc_NtkIsLogic(pNtk) )
        Abc_NtkToSop(pNtk, -1, ABC_INFINITY);
    pNetlist = Abc_NtkToNetlist(pNtk);
    if ( pNetlist == NULL )
    {
        fprintf( pErr, "Cannot produce the intermediate network.\n" );
        goto usage;
    }
    Io_WriteBlif( pNetlist, "_sis_in.blif", 1, 0, 0 );
    Abc_NtkDelete( pNetlist );

    // create the file for sis
    sprintf( Command, "%s -x -c ", pSisName );
    strcat ( Command, "\"" );
    strcat ( Command, "read_blif _sis_in.blif" );
    strcat ( Command, "; " );
    for ( i = 1; i < argc; i++ )
    {
        sprintf( Buffer, " %s", argv[i] );
        strcat( Command, Buffer );
    }
    strcat( Command, "; " );
    strcat( Command, "write_blif _sis_out.blif" );
    strcat( Command, "\"" );

    // call SIS
    if ( Util_SignalSystem( Command ) )
    {
        fprintf( pErr, "The following command has returned non-zero exit status:\n" );
        fprintf( pErr, "\"%s\"\n", Command );
        unlink( "_sis_in.blif" );
        goto usage;
    }

    // read in the SIS output
    if ( (pFile = fopen( "_sis_out.blif", "r" )) == NULL )
    {
        fprintf( pErr, "Cannot open SIS output file \"%s\".\n", "_sis_out.blif" );
        unlink( "_sis_in.blif" );
        goto usage;
    }
    fclose( pFile );

    // set the new network
    pNtkNew = Io_Read( "_sis_out.blif", IO_FILE_BLIF, 1, 0 );
    // set the original spec of the new network
    if ( pNtk->pSpec )
    {
        ABC_FREE( pNtkNew->pSpec );
        pNtkNew->pSpec = Extra_UtilStrsav( pNtk->pSpec );
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkNew );

    // remove temporary networks
    unlink( "_sis_in.blif" );
    unlink( "_sis_out.blif" );
    return 0;

usage:
    fprintf( pErr, "Usage: sis [-h] <com>\n");
    fprintf( pErr, "         invokes SIS command for the current ABC network\n" );
    fprintf( pErr, "         (the executable of SIS should be in the same directory)\n" );
    fprintf( pErr, "   -h  : print the command usage\n" );
    fprintf( pErr, " <com> : a SIS command (or a semicolon-separated list of commands in quotes)\n" );
    fprintf( pErr, "         Example 1: sis eliminate 0\n" );
    fprintf( pErr, "         Example 2: sis \"ps; rd; fx; ps\"\n" );
    fprintf( pErr, "         Example 3: sis source script.rugged\n" );
    return 1;                   // error exit
}